

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsfulmat.cpp
# Opt level: O0

int __thiscall
TPZSFMatrix<long_double>::Redim(TPZSFMatrix<long_double> *this,int64_t newDim,int64_t param_3)

{
  undefined1 auVar1 [16];
  long lVar2;
  ulong uVar3;
  void *pvVar4;
  long lVar5;
  long in_RSI;
  long *in_RDI;
  longdouble *end;
  longdouble *dst;
  longdouble *local_20;
  
  lVar2 = (**(code **)(*in_RDI + 0x60))();
  if (in_RSI != lVar2) {
    in_RDI[2] = in_RSI;
    in_RDI[1] = in_RSI;
    if ((in_RDI[4] != 0) && ((void *)in_RDI[4] != (void *)0x0)) {
      operator_delete((void *)in_RDI[4],0x10);
    }
    uVar3 = (**(code **)(*in_RDI + 600))();
    auVar1._8_8_ = 0;
    auVar1._0_8_ = uVar3;
    uVar3 = SUB168(auVar1 * ZEXT816(0x10),0);
    if (SUB168(auVar1 * ZEXT816(0x10),8) != 0) {
      uVar3 = 0xffffffffffffffff;
    }
    pvVar4 = operator_new__(uVar3);
    in_RDI[4] = (long)pvVar4;
  }
  local_20 = (longdouble *)in_RDI[4];
  lVar2 = in_RDI[4];
  lVar5 = (**(code **)(*in_RDI + 600))();
  while (local_20 < (longdouble *)(lVar2 + lVar5 * 0x10)) {
    *local_20 = (longdouble)0;
    local_20 = local_20 + 1;
  }
  *(undefined1 *)(in_RDI + 3) = 0;
  *(undefined1 *)((long)in_RDI + 0x19) = 0;
  return 1;
}

Assistant:

int
TPZSFMatrix<TVar> ::Redim( int64_t newDim , int64_t)
{
	// Se for preciso, desaloca a matriz antiga e aloca uma
	//  nova com o novo tamanho.
	if ( newDim != this->Dim() )
    {
		this->fRow = this->fCol = newDim;
		if ( fElem != NULL )
			delete( fElem );
		fElem = new TVar[Size()] ;
    }
	
	// Zera a matriz.
	TVar *dst = fElem;
	TVar *end = &fElem[ Size() ];
	while ( dst < end )
		*dst++ = 0.;
	this->fDecomposed = 0;
	this->fDefPositive = 0;
	
	
	return( 1 );
}